

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.h
# Opt level: O0

node<NULLC::Range> * __thiscall
TypedObjectPool<detail::node<NULLC::Range>,_1024>::Allocate
          (TypedObjectPool<detail::node<NULLC::Range>,_1024> *this)

{
  uint uVar1;
  MyLargeBlock *pMVar2;
  MyLargeBlock *newPage;
  MySmallBlock *result;
  TypedObjectPool<detail::node<NULLC::Range>,_1024> *this_local;
  
  if (this->freeBlocks == (MySmallBlock *)0x0) {
    if (this->lastNum == 0x400) {
      pMVar2 = (MyLargeBlock *)(*(code *)NULLC::alloc)(0xa008);
      pMVar2->next = this->activePages;
      this->activePages = pMVar2;
      this->lastNum = 0;
    }
    uVar1 = this->lastNum;
    this->lastNum = uVar1 + 1;
    newPage = (MyLargeBlock *)(this->activePages->page + uVar1);
  }
  else {
    newPage = (MyLargeBlock *)this->freeBlocks;
    this->freeBlocks = this->freeBlocks->next;
  }
  detail::node<NULLC::Range>::node((node<NULLC::Range> *)newPage);
  return (node<NULLC::Range> *)newPage;
}

Assistant:

T* Allocate()
	{
		MySmallBlock *result;
		if(freeBlocks)
		{
			result = freeBlocks;
			freeBlocks = freeBlocks->next;
		}else{
			if(lastNum == countInBlock)
			{
				MyLargeBlock *newPage = new(NULLC::alloc(sizeof(MyLargeBlock))) MyLargeBlock;
				newPage->next = activePages;
				activePages = newPage;
				lastNum = 0;
			}
			result = &activePages->page[lastNum++];
		}
		return new(result) T;
	}